

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

internalJSONNode * internalJSONNode::newInternal(char mytype)

{
  internalJSONNode *piVar1;
  jsonChildren *pjVar2;
  
  piVar1 = (internalJSONNode *)operator_new(0x78);
  piVar1->_type = mytype;
  (piVar1->_name)._M_dataplus._M_p = (pointer)&(piVar1->_name).field_2;
  pjVar2 = (jsonChildren *)0x0;
  (piVar1->_name)._M_string_length = 0;
  (piVar1->_name).field_2._M_local_buf[0] = '\0';
  piVar1->_name_encoded = false;
  (piVar1->_string)._M_dataplus._M_p = (pointer)&(piVar1->_string).field_2;
  (piVar1->_string)._M_string_length = 0;
  (piVar1->_string).field_2._M_local_buf[0] = '\0';
  piVar1->_string_encoded = false;
  (piVar1->_value)._number = 0.0;
  piVar1->refcount = 1;
  piVar1->fetched = true;
  if ((mytype & 0xfeU) == 4) {
    pjVar2 = (jsonChildren *)operator_new(0x10);
    pjVar2->array = (JSONNode **)0x0;
    pjVar2->mysize = 0;
    pjVar2->mycapacity = 0;
  }
  piVar1->Children = pjVar2;
  return piVar1;
}

Assistant:

internalJSONNode * internalJSONNode::newInternal(char mytype) {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		return new((internalJSONNode*)json_internal_mempool.allocate()) internalJSONNode(mytype);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		return new(json_malloc<internalJSONNode>(1)) internalJSONNode(mytype);
	#else /*<- else */
		return new internalJSONNode(mytype);
	#endif /*<- */
}